

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O2

void __thiscall Scs::Server::SendAll(Server *this,void *data,size_t bytes)

{
  ClientConnectionList *pCVar1;
  _List_node_base *p_Var2;
  BufferPtr buffer;
  shared_ptr<Scs::Server::ClientConnection> connection;
  vector<unsigned_char,Scs::Allocator<unsigned_char>> *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::mutex::lock(&this->m_connectionListMutex);
  pCVar1 = &this->m_connectionList;
  if ((this->m_connectionList).
      super__List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)pCVar1) {
    CreateBuffer();
    std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              (local_50,(const_iterator)*(uchar **)(local_50 + 8),(uchar *)data,
               (uchar *)((long)data + bytes));
    p_Var2 = (_List_node_base *)pCVar1;
    while (p_Var2 = (((_List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
                       *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)pCVar1) {
      std::__shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 (__shared_ptr<Scs::Server::ClientConnection,_(__gnu_cxx::_Lock_policy)2> *)
                 (p_Var2 + 1));
      SendQueue::Push(&(local_40._M_ptr)->sendQueue,data,bytes);
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_refcount);
    }
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_connectionListMutex);
  return;
}

Assistant:

void Server::SendAll(const void * data, size_t bytes)
{
	std::lock_guard<std::mutex> lock(m_connectionListMutex);
	if (m_connectionList.empty())
		return;
	BufferPtr buffer = CreateBuffer();
	buffer->insert(buffer->end(), static_cast<const uint8_t *>(data), static_cast<const uint8_t *>(data) + bytes);
	for (auto connection : m_connectionList)
		connection->sendQueue.Push(data, bytes);
}